

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O0

void * ffi_checkptr(lua_State *L,int narg,CTypeID id)

{
  void *local_60;
  void *p;
  TValue *o;
  CTState *cts;
  CTypeID id_local;
  int narg_local;
  lua_State *L_local;
  CTState *cts_1;
  CTypeID local_24;
  TValue *local_20;
  CTypeID local_14;
  TValue *local_10;
  
  o = *(TValue **)((L->glref).ptr64 + 0x180);
  o[2] = (TValue)L;
  p = L->base + (long)narg + -1;
  cts._0_4_ = id;
  cts._4_4_ = narg;
  _id_local = L;
  L_local = (lua_State *)o;
  cts_1 = (CTState *)L;
  if (L->top <= p) {
    lj_err_arg(L,narg,LJ_ERR_NOVAL);
  }
  local_24 = id;
  local_20 = o;
  local_14 = id;
  local_10 = o;
  lj_cconv_ct_tv((CTState *)&o->gcr,(CType *)(o->u64 + (ulong)id * 0x18),(uint8_t *)&local_60,
                 (TValue *)p,narg << 8);
  return local_60;
}

Assistant:

static void *ffi_checkptr(lua_State *L, int narg, CTypeID id)
{
  CTState *cts = ctype_cts(L);
  TValue *o = L->base + narg-1;
  void *p;
  if (o >= L->top)
    lj_err_arg(L, narg, LJ_ERR_NOVAL);
  lj_cconv_ct_tv(cts, ctype_get(cts, id), (uint8_t *)&p, o, CCF_ARG(narg));
  return p;
}